

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O0

Result __thiscall
testing::
Action<solitaire::graphics::TextureId_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
::Perform(Action<solitaire::graphics::TextureId_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *this,ArgumentTuple *args)

{
  bool bVar1;
  tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  *in_RDX;
  ArgumentTuple *args_local;
  Action<solitaire::graphics::TextureId_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *this_local;
  
  bVar1 = IsDoDefault((Action<solitaire::graphics::TextureId_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                       *)args);
  if (bVar1) {
    internal::IllegalDoDefault
              ("/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/externalLibs/googletest/googlemock/include/gmock/gmock-actions.h"
               ,0x1f0);
  }
  internal::
  Apply<std::function<solitaire::graphics::TextureId(std::__cxx11::string_const&)>const&,std::tuple<std::__cxx11::string_const&>>
            ((internal *)this,
             (function<solitaire::graphics::TextureId_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)args,in_RDX);
  return (Result)(uint)this;
}

Assistant:

Result Perform(ArgumentTuple args) const {
    if (IsDoDefault()) {
      internal::IllegalDoDefault(__FILE__, __LINE__);
    }
    return internal::Apply(fun_, ::std::move(args));
  }